

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int tls_prf_sha256(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
                  size_t dlen)

{
  int iVar1;
  uchar *dstbuf_local;
  size_t rlen_local;
  uchar *random_local;
  char *label_local;
  size_t slen_local;
  uchar *secret_local;
  
  iVar1 = tls_prf_generic(MBEDTLS_MD_SHA256,secret,slen,label,random,rlen,dstbuf,dlen);
  return iVar1;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int tls_prf_sha256(const unsigned char *secret, size_t slen,
                          const char *label,
                          const unsigned char *random, size_t rlen,
                          unsigned char *dstbuf, size_t dlen)
{
    return tls_prf_generic(MBEDTLS_MD_SHA256, secret, slen,
                           label, random, rlen, dstbuf, dlen);
}